

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
               (tuple<long,_int,_int,_int> *begin,tuple<long,_int,_int,_int> *end)

{
  tuple<long,_int,_int,_int> *__t;
  bool bVar1;
  long lVar2;
  tuple<long,_int,_int,_int> *ptVar3;
  tuple<long,_int,_int,_int> *ptVar4;
  long lVar5;
  tuple<long,_int,_int,_int> local_50;
  tuple<long,_int,_int,_int> *local_38;
  
  if (begin != end) {
    lVar5 = 0;
    ptVar4 = begin;
    local_38 = end;
    while (__t = ptVar4 + 1, __t != end) {
      bVar1 = std::
              __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
              ::__less(__t,ptVar4);
      if (bVar1) {
        local_50.super__Tuple_impl<0UL,_long,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int> = *(_Tuple_impl<2UL,_int,_int> *)(ptVar4 + 1);
        local_50.super__Tuple_impl<0UL,_long,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             ptVar4[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        local_50.super__Tuple_impl<0UL,_long,_int,_int,_int>.super__Head_base<0UL,_long,_false>.
        _M_head_impl = ptVar4[1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
        lVar2 = lVar5;
        ptVar4 = __t;
        do {
          ptVar3 = ptVar4;
          (ptVar3->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
          _M_head_impl = ptVar3[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
                         super__Head_base<0UL,_long,_false>._M_head_impl;
          (ptVar3->super__Tuple_impl<0UL,_long,_int,_int,_int>).
          super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
               ptVar3[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
               super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
          (ptVar3->super__Tuple_impl<0UL,_long,_int,_int,_int>).
          super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> =
               ptVar3[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.
               super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
          ptVar4 = begin;
          if (lVar2 == 0) break;
          ptVar4 = ptVar3 + -1;
          bVar1 = std::
                  __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                  ::__less(&local_50,ptVar3 + -2);
          lVar2 = lVar2 + 0x18;
        } while (bVar1);
        ptVar3[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.super__Head_base<0UL,_long,_false>.
        _M_head_impl = local_50.super__Tuple_impl<0UL,_long,_int,_int,_int>.
                       super__Head_base<0UL,_long,_false>._M_head_impl;
        ptVar3[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
        .super__Head_base<1UL,_int,_false>._M_head_impl =
             local_50.super__Tuple_impl<0UL,_long,_int,_int,_int>.
             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        ptVar3[-1].super__Tuple_impl<0UL,_long,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
        .super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             local_50.super__Tuple_impl<0UL,_long,_int,_int,_int>.
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
             super__Head_base<2UL,_int,_false>._M_head_impl;
        (ptVar4->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
        super__Head_base<3UL,_int,_false>._M_head_impl =
             (int)local_50.super__Tuple_impl<0UL,_long,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                  super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
        end = local_38;
      }
      lVar5 = lVar5 + -0x18;
      ptVar4 = __t;
    }
  }
  return;
}

Assistant:

inline void insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }